

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  byte bVar1;
  bool bVar2;
  Syntax SVar3;
  FileDescriptor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool is_descriptor;
  GeneratorContext *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_1;
  
  bVar1 = std::operator==(in_R8,(char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8
                                                ));
  if ((bool)bVar1) {
    FileDescriptor::name_abi_cxx11_(in_RSI);
    bVar2 = std::operator!=(in_R8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)in_R8,
                 "Can only generate PHP code for google/protobuf/descriptor.proto.\n");
      return false;
    }
  }
  if (((bVar1 & 1) == 0) && (SVar3 = FileDescriptor::syntax(in_RSI), SVar3 != SYNTAX_PROTO3)) {
    std::__cxx11::string::operator=
              ((string *)in_R8,
               "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
              );
    local_1 = false;
  }
  else {
    GenerateFile((FileDescriptor *)generator_context,error._7_1_,unaff_retaddr);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const string& parameter,
                         GeneratorContext* generator_context,
                         string* error) const {
  bool is_descriptor = parameter == "internal";

  if (is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, is_descriptor, generator_context);

  return true;
}